

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
Utf8Decode_LonelyStartCharacters_Test::~Utf8Decode_LonelyStartCharacters_Test
          (Utf8Decode_LonelyStartCharacters_Test *this)

{
  Utf8Decode_LonelyStartCharacters_Test *this_local;
  
  ~Utf8Decode_LonelyStartCharacters_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Utf8Decode, LonelyStartCharacters) {
    // All 32 first bytes of 2-byte sequences (0xC0-0xDF), each followed by a space character.
    for (std::uint8_t v = 0xC0; v <= 0xDF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 16 first bytes of 3-byte sequences (0xE0-0xEF), each followed by a space character.
    for (std::uint8_t v = 0xE0; v <= 0xEF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 8 first bytes of 4-byte sequences (0xF0-0xF7), each followed by a space character.
    for (std::uint8_t v = 0xF0; v <= 0xF7; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
}